

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_zip.c
# Opt level: O1

wchar_t check_authentication_code(archive_read *a,void *_p)

{
  void *pvVar1;
  long lVar2;
  bool bVar3;
  long lVar4;
  wchar_t wVar5;
  int64_t iVar6;
  uint8_t hmac [20];
  size_t hmac_len;
  long local_48;
  short local_40;
  size_t local_28;
  
  pvVar1 = a->format->data;
  if (*(char *)((long)pvVar1 + 0x194) != '\0') {
    local_28 = 0x14;
    __hmac_sha1_final((archive_hmac_sha1_ctx *)((long)pvVar1 + 400),(uint8_t *)&local_48,&local_28);
    if ((_p == (void *)0x0) &&
       (_p = __archive_read_ahead(a,10,(ssize_t *)0x0), (long *)_p == (long *)0x0)) {
      bVar3 = false;
      archive_set_error(&a->archive,0x54,"Truncated ZIP file data");
      wVar5 = L'\xffffffe2';
    }
    else {
      lVar2 = *_p;
      lVar4 = *(long *)((long)_p + 8);
      iVar6 = __archive_read_consume(a,10);
      wVar5 = (wchar_t)iVar6;
      if (local_40 == (short)lVar4 && local_48 == lVar2) {
        bVar3 = true;
      }
      else {
        bVar3 = false;
        archive_set_error(&a->archive,-1,"ZIP bad Authentication code");
        wVar5 = L'\xffffffec';
      }
    }
    if (!bVar3) {
      return wVar5;
    }
  }
  return L'\0';
}

Assistant:

static int
check_authentication_code(struct archive_read *a, const void *_p)
{
	struct zip *zip = (struct zip *)(a->format->data);

	/* Check authentication code. */
	if (zip->hctx_valid) {
		const void *p;
		uint8_t hmac[20];
		size_t hmac_len = 20;
		int cmp;

		archive_hmac_sha1_final(&zip->hctx, hmac, &hmac_len);
		if (_p == NULL) {
			/* Read authentication code. */
			p = __archive_read_ahead(a, AUTH_CODE_SIZE, NULL);
			if (p == NULL) {
				archive_set_error(&a->archive,
				    ARCHIVE_ERRNO_FILE_FORMAT,
				    "Truncated ZIP file data");
				return (ARCHIVE_FATAL);
			}
		} else {
			p = _p;
		}
		cmp = memcmp(hmac, p, AUTH_CODE_SIZE);
		__archive_read_consume(a, AUTH_CODE_SIZE);
		if (cmp != 0) {
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_MISC,
			    "ZIP bad Authentication code");
			return (ARCHIVE_WARN);
		}
	}
	return (ARCHIVE_OK);
}